

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O2

string * __thiscall
ADSBExchangeConnection::GetStatusText_abi_cxx11_
          (string *__return_storage_ptr__,ADSBExchangeConnection *this)

{
  int iVar1;
  char *__format;
  float fVar2;
  string sStack_58;
  char t [25];
  
  LTChannel::GetStatusText_abi_cxx11_(__return_storage_ptr__,(LTChannel *)this);
  iVar1 = (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.super_LTChannel.
            _vptr_LTChannel[6])(this);
  if ((char)iVar1 != '\0') {
    iVar1 = (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.super_LTChannel
              ._vptr_LTChannel[10])(this);
    if (((byte)iVar1 & 0 < dataRefs.ADSBExRLimit) == 1) {
      t[0x10] = '\0';
      t[0x11] = '\0';
      t[0x12] = '\0';
      t[0x13] = '\0';
      t[0x14] = '\0';
      t[0x15] = '\0';
      t[0x16] = '\0';
      t[0x17] = '\0';
      t[0x18] = '\0';
      t[0] = '\0';
      t[1] = '\0';
      t[2] = '\0';
      t[3] = '\0';
      t[4] = '\0';
      t[5] = '\0';
      t[6] = '\0';
      t[7] = '\0';
      t[8] = '\0';
      t[9] = '\0';
      t[10] = '\0';
      t[0xb] = '\0';
      t[0xc] = '\0';
      t[0xd] = '\0';
      t[0xe] = '\0';
      t[0xf] = '\0';
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::to_string(&sStack_58,dataRefs.ADSBExRRemain);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_58);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::to_string(&sStack_58,dataRefs.ADSBExRLimit);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_58);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (dataRefs.ADSBExRReset < 0x2a301) {
        if (dataRefs.ADSBExRReset < 0x1c21) {
          fVar2 = (float)dataRefs.ADSBExRReset / 60.0;
          __format = "%.1f minutes";
        }
        else {
          fVar2 = (float)dataRefs.ADSBExRReset / 3600.0;
          __format = "%.1f hours";
        }
      }
      else {
        fVar2 = (float)dataRefs.ADSBExRReset / 86400.0;
        __format = "%.1f days";
      }
      snprintf(t,0x19,__format,SUB84((double)fVar2,0));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ADSBExchangeConnection::GetStatusText () const
{
    std::string s = LTChannel::GetStatusText();
    if (IsValid() && IsEnabled() && dataRefs.ADSBExRLimit > 0)
    {
        char t[25] = "";
        s += " | ";
        s += std::to_string(dataRefs.ADSBExRRemain);
        s += " of ";
        s += std::to_string(dataRefs.ADSBExRLimit);
        s += " RAPID API requests left, resets in ";
        if (dataRefs.ADSBExRReset > 48*60*60)           // more than 2 days
            snprintf(t, sizeof(t), "%.1f days",
                    float(dataRefs.ADSBExRReset) / (24.0f*60.0f*60.0f));
        else if (dataRefs.ADSBExRReset >  2*60*60)      // more than 2 hours
            snprintf(t, sizeof(t), "%.1f hours",
                    float(dataRefs.ADSBExRReset) / (      60.0f*60.0f));
        else                                            // less than 2 hours
            snprintf(t, sizeof(t), "%.1f minutes",
                    float(dataRefs.ADSBExRReset) / (            60.0f));
        s += t;
    }
    return s;
}